

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O1

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)

{
  byte bVar1;
  uint8_t uVar2;
  mbedtls_ecp_group_id grp_id;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_config *pmVar4;
  size_t sVar5;
  mbedtls_x509_crt *pmVar6;
  mbedtls_ssl_session *pmVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  mbedtls_md_type_t type;
  uchar uVar10;
  uint16_t uVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  mbedtls_ssl_protocol_version mVar15;
  uchar *puVar16;
  mbedtls_ssl_key_cert *pmVar17;
  mbedtls_ssl_ciphersuite_t *pmVar18;
  int *piVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  mbedtls_pk_context_conflict *pmVar24;
  char *pcVar25;
  ushort sig_alg;
  ulong uVar26;
  uchar *puVar27;
  int iVar28;
  ushort *puVar29;
  ulong uVar30;
  uchar *puVar31;
  long lVar32;
  bool bVar33;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar34;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 uVar35;
  size_t local_1a8;
  uchar hash [32];
  ushort uStack_a8;
  uchar *p;
  uchar *local_98;
  int iStack_90;
  undefined4 uStack_8c;
  size_t local_88;
  uchar *puStack_80;
  mbedtls_asn1_named_data *local_78;
  uchar uStack_70;
  undefined7 uStack_6f;
  uchar *local_60;
  mbedtls_md_type_t local_58;
  undefined4 uStack_54;
  mbedtls_md_type_t md_alg;
  mbedtls_md_type_t local_4c;
  ushort *local_48;
  size_t hashlen;
  undefined8 local_38;
  
  uVar35 = (undefined4)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    return 0;
  case 1:
    iVar13 = mbedtls_ssl_write_client_hello(ssl);
    return iVar13;
  case 2:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x4a9,"=> parse server hello");
    iVar13 = mbedtls_ssl_read_record(ssl,1);
    if (iVar13 != 0) {
      pcVar25 = "mbedtls_ssl_read_record";
      iVar23 = 0x4ad;
      goto LAB_001abaaf;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar25 = "bad server hello message";
      iVar13 = 0x4c7;
      goto LAB_001aaecc;
    }
    puVar31 = ssl->in_msg;
    if (ssl->conf->transport == '\x01') {
      if (*puVar31 == '\x03') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4d2,"received hello verify request");
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4d3,"<= parse server hello");
        puVar31 = ssl->in_msg;
        uVar2 = ssl->conf->transport;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x450,"=> parse hello verify request");
        if ((ulong)(ssl->conf->transport == '\x01') * 8 + 7 <= ssl->in_msglen) {
          bVar33 = uVar2 == '\x01';
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x464,"server version",puVar31 + (ulong)bVar33 * 8 + 4,2);
          if ((*(ushort *)(puVar31 + (ulong)bVar33 * 8 + 4) & 0xfdff) == 0xfdfe) {
            bVar1 = puVar31[(ulong)bVar33 * 8 + 6];
            puVar31 = puVar31 + (ulong)bVar33 * 8 + 7;
            uVar30 = (ulong)bVar1;
            if ((long)uVar30 <= (long)(ssl->in_msg + (ssl->in_msglen - (long)puVar31))) {
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x47e,"cookie",puVar31,uVar30);
              free(ssl->handshake->cookie);
              puVar16 = (uchar *)calloc(1,uVar30);
              pmVar3 = ssl->handshake;
              pmVar3->cookie = puVar16;
              if (puVar16 == (uchar *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x484,"alloc failed (%d bytes)",uVar30);
                return -0x7f00;
              }
              memcpy(puVar16,puVar31,uVar30);
              pmVar3->cookie_len = bVar1;
              ssl->state = 1;
              iVar13 = mbedtls_ssl_reset_checksum(ssl);
              if (iVar13 == 0) {
                mbedtls_ssl_recv_flight_completed(ssl);
                pcVar25 = "<= parse hello verify request";
                iVar28 = 0;
                iVar23 = 2;
                iVar13 = 0x495;
                break;
              }
              pcVar25 = "mbedtls_ssl_reset_checksum";
              iVar23 = 0x48f;
              goto LAB_001abaaf;
            }
            pcVar25 = "cookie length does not match incoming message size";
            iVar13 = 0x479;
            goto LAB_001ab22e;
          }
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x46e,"bad server version");
          goto LAB_001ab680;
        }
        pcVar25 = "incoming HelloVerifyRequest message is too short";
        iVar13 = 0x458;
        goto LAB_001ab22e;
      }
      free(ssl->handshake->cookie);
      pmVar3 = ssl->handshake;
      pmVar3->cookie = (uchar *)0x0;
      pmVar3->cookie_len = '\0';
    }
    uVar30 = (ulong)(ssl->conf->transport == '\x01') * 8;
    if ((ssl->in_hslen < uVar30 + 0x2a) || (*puVar31 != '\x02')) {
      pcVar25 = "bad server hello message";
      iVar13 = 0x4e0;
      goto LAB_001ab22e;
    }
    puVar31 = puVar31 + (uVar30 | 4);
    uVar34 = 0;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x4f3,"server hello, version",puVar31,2);
    uVar11 = mbedtls_ssl_read_version(puVar31,(uint)ssl->conf->transport);
    ssl->tls_version = (uint)uVar11;
    ssl->session_negotiate->tls_version = (uint)uVar11;
    pmVar4 = ssl->conf;
    mVar15 = (mbedtls_ssl_protocol_version)uVar11;
    if ((mVar15 < pmVar4->min_tls_version) || (pmVar4->max_tls_version < mVar15)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x4ff,"server version out of bounds -  min: [0x%x], server: [0x%x], max: [0x%x]",
                 (ulong)pmVar4->min_tls_version,CONCAT44(uVar34,mVar15),
                 CONCAT44(uVar35,pmVar4->max_tls_version));
LAB_001ab680:
      mbedtls_ssl_send_alert_message(ssl,'\x02','F');
      return -0x6e80;
    }
    uVar14 = *(uint *)(puVar31 + 2);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x50b,"server hello, current time: %lu",
               (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18));
    pmVar3 = ssl->handshake;
    uVar20 = *(undefined8 *)(puVar31 + 2);
    uVar8 = *(undefined8 *)(puVar31 + 10);
    uVar9 = *(undefined8 *)(puVar31 + 0x1a);
    *(undefined8 *)(pmVar3->randbytes + 0x30) = *(undefined8 *)(puVar31 + 0x12);
    *(undefined8 *)(pmVar3->randbytes + 0x38) = uVar9;
    *(undefined8 *)(pmVar3->randbytes + 0x20) = uVar20;
    *(undefined8 *)(pmVar3->randbytes + 0x28) = uVar8;
    bVar1 = puVar31[0x22];
    uVar30 = (ulong)bVar1;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x511,"server hello, random bytes",puVar31 + 2,0x20);
    if (0x20 < uVar30) {
      pcVar25 = "bad server hello message";
      iVar13 = 0x514;
      goto LAB_001ab22e;
    }
    puVar16 = (uchar *)ssl->in_hslen;
    uVar22 = (ulong)(ssl->conf->transport == '\x01');
    lVar32 = uVar22 * 8 + 4;
    if ((uchar *)(uVar22 * 8 + 0x2b + uVar30) < puVar16) {
      puVar27 = (uchar *)(ulong)(ushort)(*(ushort *)(puVar31 + uVar30 + 0x26) << 8 |
                                        *(ushort *)(puVar31 + uVar30 + 0x26) >> 8);
      if ((puVar27 + -1 < (uchar *)0x3) || (puVar16 != puVar27 + lVar32 + uVar30 + 0x28)) {
        pcVar25 = "bad server hello message";
        iVar13 = 0x520;
        goto LAB_001ab22e;
      }
    }
    else {
      if (puVar16 != (uchar *)(lVar32 + uVar30 + 0x26)) {
        pcVar25 = "bad server hello message";
        iVar13 = 0x52a;
        goto LAB_001ab22e;
      }
      puVar27 = (uchar *)0x0;
    }
    if (puVar31[uVar30 + 0x25] != '\0') {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x53a,"server hello, bad compression: %d");
      mbedtls_ssl_send_alert_message(ssl,'\x02','/');
      return -0x7080;
    }
    uVar14 = (uint)(ushort)(*(ushort *)(puVar31 + uVar30 + 0x23) << 8 |
                           *(ushort *)(puVar31 + uVar30 + 0x23) >> 8);
    local_38 = (ushort *)CONCAT44(local_38._4_4_,uVar14);
    pmVar18 = mbedtls_ssl_ciphersuite_from_id(uVar14);
    ssl->handshake->ciphersuite_info = pmVar18;
    if (pmVar18 == (mbedtls_ssl_ciphersuite_t *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x548,"ciphersuite info for %04x not found",(ulong)local_38 & 0xffffffff);
      mbedtls_ssl_send_alert_message(ssl,'\x02','P');
      return -0x7100;
    }
    mbedtls_ssl_optimize_checksum(ssl,pmVar18);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x550,"server hello, session id len.: %zu",uVar30);
    hashlen = (size_t)(puVar31 + 0x23);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x551,"server hello, session id",(uchar *)hashlen,uVar30);
    pmVar3 = ssl->handshake;
    if ((pmVar3->resume == '\0') || (bVar1 == 0)) {
LAB_001abe92:
      ssl->state = ssl->state + 1;
      pmVar3->resume = '\0';
      pmVar7 = ssl->session_negotiate;
      pmVar7->ciphersuite = (int)local_38;
      pmVar7->id_len = uVar30;
      memcpy(pmVar7->id,(void *)hashlen,uVar30);
    }
    else {
      pmVar7 = ssl->session_negotiate;
      if ((pmVar7->ciphersuite != (int)local_38) ||
         ((pmVar7->id_len != uVar30 ||
          (iVar13 = bcmp(pmVar7->id,(void *)hashlen,uVar30), iVar13 != 0)))) goto LAB_001abe92;
      ssl->state = 0xc;
    }
    pcVar25 = "a";
    if (ssl->handshake->resume == '\0') {
      pcVar25 = "no";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x56a,"%s session has been resumed",pcVar25);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x56c,"server hello, chosen ciphersuite: %04x",(ulong)local_38 & 0xffffffff);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x56e,"server hello, compress alg.: %d",(ulong)puVar31[uVar30 + 0x25]);
    piVar19 = ssl->conf->ciphersuite_list;
    do {
      iVar13 = *piVar19;
      if (iVar13 == 0) {
        pcVar25 = "bad server hello message";
        iVar13 = 0x576;
        goto LAB_001abb5b;
      }
      iVar23 = ssl->session_negotiate->ciphersuite;
      piVar19 = piVar19 + 1;
    } while (iVar13 != iVar23);
    pmVar18 = mbedtls_ssl_ciphersuite_from_id(iVar23);
    iVar13 = mbedtls_ssl_validate_ciphersuite(ssl,pmVar18,ssl->tls_version,ssl->tls_version);
    if (iVar13 == 0) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x591,"server hello, chosen ciphersuite: %s",pmVar18->name);
      hashlen = (size_t)(puVar31 + uVar30 + 0x28);
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x5a7,"server hello, total extension length: %zu",puVar27);
      while (puVar27 != (uchar *)0x0) {
        uVar12 = *(ushort *)(hashlen + 2) << 8 | *(ushort *)(hashlen + 2) >> 8;
        uVar30 = (ulong)uVar12;
        local_60 = (uchar *)(ulong)(uVar12 + 4);
        puVar16 = puVar27 + -(long)local_60;
        if (puVar27 < local_60) {
          local_38 = (ushort *)((ulong)local_38 & 0xffffffff00000000);
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x5b0,"bad server hello message");
          mbedtls_ssl_send_alert_message(ssl,'\x02','2');
          puVar31 = (uchar *)0xffff8d00;
          puVar16 = puVar27;
        }
        else {
          uVar12 = *(ushort *)hashlen << 8 | *(ushort *)hashlen >> 8;
          if (uVar12 < 0x100) {
            if (uVar12 == 1) {
              local_38 = (ushort *)((ulong)local_38._4_4_ << 0x20);
              uVar20 = 0x5c8;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x5c8,"found max_fragment_length extension");
              uVar14 = ssl_parse_max_fragment_length_ext(ssl,(uchar *)(hashlen + 4),uVar30);
              goto LAB_001ac371;
            }
            if (uVar12 == 0xb) {
              local_38 = (ushort *)((ulong)local_38._4_4_ << 0x20);
              uVar20 = 0x609;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x609,"found supported_point_formats extension");
              uVar14 = ssl_parse_supported_point_formats_ext(ssl,(uchar *)(hashlen + 4),uVar30);
              goto LAB_001ac371;
            }
LAB_001ac2d0:
            uVar20 = 0x639;
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x639,"unknown extension found: %u (ignoring)");
          }
          else {
            if (uVar12 == 0x100) {
              local_38 = (ushort *)((ulong)local_38._4_4_ << 0x20);
              uVar20 = 0x617;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x617,"found ecjpake_kkpp extension");
              uVar14 = ssl_parse_ecjpake_kkpp(ssl,(uchar *)(hashlen + 4),uVar30);
            }
            else {
              if (uVar12 != 0xff01) goto LAB_001ac2d0;
              local_38 = (ushort *)((ulong)local_38._4_4_ << 0x20);
              uVar20 = 0x5b9;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x5b9,"found renegotiation extension");
              uVar14 = ssl_parse_renegotiation_info(ssl,(uchar *)(hashlen + 4),uVar30);
            }
LAB_001ac371:
            if (uVar14 != 0) {
              puVar31 = (uchar *)(ulong)uVar14;
              puVar16 = puVar27;
              goto LAB_001ac3c3;
            }
          }
          hashlen = (size_t)(local_60 + hashlen);
          local_38 = (ushort *)CONCAT44(local_38._4_4_,(int)CONCAT71((int7)((ulong)uVar20 >> 8),1));
          if (puVar16 + -1 < (uchar *)0x3) {
            local_38 = (ushort *)((ulong)local_38._4_4_ << 0x20);
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x640,"bad server hello message");
            puVar31 = (uchar *)0xffff8d00;
          }
        }
LAB_001ac3c3:
        puVar27 = puVar16;
        if ((char)local_38 == '\0') {
          return (int)puVar31;
        }
      }
      if ((ssl->handshake->resume != '\0') && (iVar13 = mbedtls_ssl_derive_keys(ssl), iVar13 != 0))
      {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x64c,"mbedtls_ssl_derive_keys",iVar13);
        mbedtls_ssl_send_alert_message(ssl,'\x02','P');
        return iVar13;
      }
      if ((ssl->secure_renegotiation != 0) || (ssl->conf->allow_legacy_renegotiation != '\x02')) {
        pcVar25 = "<= parse server hello";
        iVar28 = 0;
        iVar23 = 2;
        iVar13 = 0x67d;
        break;
      }
      pcVar25 = "legacy renegotiation, breaking off handshake";
      iVar13 = 0x65c;
    }
    else {
      pcVar25 = "bad server hello message";
      iVar13 = 0x588;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,iVar13,pcVar25);
LAB_001ab641:
    mbedtls_ssl_send_alert_message(ssl,'\x02','(');
    return -0x6e00;
  case 3:
    iVar13 = mbedtls_ssl_parse_certificate(ssl);
    return iVar13;
  case 4:
    pmVar18 = ssl->handshake->ciphersuite_info;
    _uStack_a8 = (ushort *)0x0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x82a,"=> parse server key exchange");
    iVar13 = mbedtls_ssl_read_record(ssl,1);
    if (iVar13 != 0) {
      pcVar25 = "mbedtls_ssl_read_record";
      iVar23 = 0x854;
      goto LAB_001abaaf;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar25 = "bad server key exchange message";
      iVar13 = 0x859;
LAB_001aaecc:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar13,pcVar25);
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      return -0x7700;
    }
    puVar31 = ssl->in_msg;
    if (*puVar31 == '\f') {
      uVar30 = (ulong)(ssl->conf->transport == '\x01');
      _uStack_a8 = (ushort *)(puVar31 + uVar30 * 8 + 4);
      puVar29 = (ushort *)(puVar31 + ssl->in_hslen);
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x881,"server key exchange",(uchar *)_uStack_a8,ssl->in_hslen - (uVar30 * 8 + 4));
      bVar1 = pmVar18->key_exchange;
      if ((byte)(bVar1 - 5) < 4) {
        iVar13 = 0x75b;
        if (1 < (long)puVar29 - (long)_uStack_a8) {
          uVar30 = (ulong)(ushort)(*_uStack_a8 << 8 | *_uStack_a8 >> 8);
          _uStack_a8 = _uStack_a8 + 1;
          iVar13 = 0x763;
          if ((long)uVar30 <= (long)puVar29 - (long)_uStack_a8) {
            _uStack_a8 = (ushort *)((long)_uStack_a8 + uVar30);
            goto LAB_001ab490;
          }
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar13,"bad server key exchange message (psk_identity_hint length)");
        pcVar25 = "bad server key exchange message";
        iVar13 = 0x889;
LAB_001ab22e:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar13,pcVar25);
        mbedtls_ssl_send_alert_message(ssl,'\x02','2');
        return -0x7300;
      }
LAB_001ab490:
      if (0xb < bVar1) {
LAB_001ab814:
        iVar13 = 0x8f2;
LAB_001ab2fe:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar13,"should never happen");
        return -0x6c00;
      }
      if ((0x118U >> (bVar1 & 0x1f) & 1) != 0) {
        iVar13 = mbedtls_ecdh_read_params
                           (&ssl->handshake->ecdh_ctx,(uchar **)&stack0xffffffffffffff58,
                            (uchar *)puVar29);
        if (iVar13 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x735,"mbedtls_ecdh_read_params",iVar13);
          goto LAB_001abb40;
        }
        grp_id = (ssl->handshake->ecdh_ctx).grp_id;
        uVar11 = mbedtls_ssl_get_tls_id_from_ecp_group_id(grp_id);
        if (uVar11 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x70a,"should never happen");
        }
        else {
          pcVar25 = mbedtls_ssl_get_curve_name_from_tls_id(uVar11);
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x70f,"ECDH curve: %s",pcVar25);
          iVar13 = mbedtls_ssl_check_curve(ssl,grp_id);
          if (iVar13 == 0) {
            mbedtls_debug_printf_ecdh
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x716,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_QP);
            goto LAB_001ab4b5;
          }
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x740,"bad server key exchange message (ECDHE curve)");
LAB_001abb40:
        pcVar25 = "bad server key exchange message";
        iVar13 = 0x8b1;
LAB_001abb5b:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,iVar13,pcVar25);
        mbedtls_ssl_send_alert_message(ssl,'\x02','/');
        return -0x6600;
      }
      if ((0xa0U >> (bVar1 & 0x1f) & 1) == 0) {
        if (bVar1 != 0xb) goto LAB_001ab814;
        iVar13 = mbedtls_ecjpake_read_round_two
                           (&ssl->handshake->ecjpake_ctx,(uchar *)_uStack_a8,
                            (long)puVar29 - (long)_uStack_a8);
        if (iVar13 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x8e7,"mbedtls_ecjpake_read_round_two",iVar13);
          goto LAB_001ab641;
        }
      }
LAB_001ab4b5:
      if (0xfc < (byte)(pmVar18->key_exchange - 5)) {
        local_58 = MBEDTLS_MD_NONE;
        md_alg = MBEDTLS_MD_NONE;
        pmVar6 = ssl->session_negotiate->peer_cert;
        if (pmVar6 == (mbedtls_x509_crt *)0x0) {
          iVar13 = 0x909;
LAB_001abaea:
          bVar33 = false;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,iVar13,"should never happen");
          puVar29 = (ushort *)0xffff9400;
          goto LAB_001abdca;
        }
        if (puVar29 < _uStack_a8 || (ulong)((long)puVar29 - (long)_uStack_a8) < 2) {
          bVar33 = false;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x912,"missing input data in %s","ssl_parse_server_key_exchange");
          puVar29 = (ushort *)0xffff8d00;
          mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
          goto LAB_001abdca;
        }
        hashlen = CONCAT71(hashlen._1_7_,ssl->conf->transport == '\x01');
        local_60 = ssl->in_msg;
        local_38 = _uStack_a8;
        uVar12 = *_uStack_a8;
        sig_alg = uVar12 << 8 | uVar12 >> 8;
        iVar13 = mbedtls_ssl_get_pk_type_and_md_alg_from_sig_alg(sig_alg,&md_alg,&local_58);
        if (((iVar13 == 0) || (iVar13 = mbedtls_ssl_sig_alg_is_offered(ssl,sig_alg), iVar13 != 0))
           || ((ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2 &&
               (((char)(uVar12 >> 8) == '\x03' && (0xfd < (byte)((char)uVar12 - 5U))))))) {
          type = md_alg;
          pmVar24 = &pmVar6->pk;
          _uStack_a8 = _uStack_a8 + 1;
          iVar13 = mbedtls_pk_can_do(pmVar24,md_alg);
          if (iVar13 == 0) {
            iVar13 = 0x924;
            goto LAB_001abdab;
          }
          if (puVar29 + -1 < _uStack_a8) {
            iVar13 = 0x931;
LAB_001abd4b:
            bVar33 = false;
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,iVar13,"bad server key exchange message");
            mbedtls_ssl_send_alert_message(ssl,'\x02','2');
            puVar29 = (ushort *)0xffff8d00;
          }
          else {
            uVar30 = (ulong)(ushort)(*_uStack_a8 << 8 | *_uStack_a8 >> 8);
            _uStack_a8 = _uStack_a8 + 1;
            puVar29 = (ushort *)((long)puVar29 - uVar30);
            if (_uStack_a8 != puVar29) {
              iVar13 = 0x93c;
              goto LAB_001abd4b;
            }
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x944,"signature",(uchar *)_uStack_a8,uVar30);
            local_4c = local_58;
            if (local_58 == MBEDTLS_MD_NONE) {
              iVar13 = 0x951;
              goto LAB_001abaea;
            }
            uVar14 = mbedtls_ssl_get_key_exchange_md_tls1_2
                               (ssl,(uchar *)&local_1a8,(size_t *)&local_48,
                                local_60 + (hashlen & 0xff) * 8 + 4,
                                (long)local_38 - (long)(local_60 + (hashlen & 0xff) * 8 + 4),
                                local_58);
            if (uVar14 == 0) {
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x955,"parameters hash",(uchar *)&local_1a8,(size_t)local_48);
              iVar13 = mbedtls_pk_can_do(pmVar24,type);
              if (iVar13 == 0) {
                bVar33 = false;
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x95b,"bad server key exchange message");
                mbedtls_ssl_send_alert_message(ssl,'\x02','(');
                puVar29 = (ushort *)0xffff9300;
              }
              else {
                uVar14 = mbedtls_pk_verify_restartable
                                   (pmVar24,local_4c,(uchar *)&local_1a8,(size_t)local_48,
                                    (uchar *)_uStack_a8,uVar30,(mbedtls_pk_restart_ctx *)0x0);
                if (uVar14 != 0) {
                  mbedtls_ssl_send_alert_message(ssl,'\x02','3');
                  mbedtls_debug_print_ret
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                             ,0x987,"mbedtls_pk_verify",uVar14);
                  goto LAB_001ac010;
                }
                bVar33 = true;
              }
            }
            else {
LAB_001ac010:
              puVar29 = (ushort *)(ulong)uVar14;
              bVar33 = false;
            }
          }
        }
        else {
          iVar13 = 0x919;
LAB_001abdab:
          bVar33 = false;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,iVar13,"bad server key exchange message");
          mbedtls_ssl_send_alert_message(ssl,'\x02','/');
          puVar29 = (ushort *)0xffff9a00;
        }
LAB_001abdca:
        if (!bVar33) {
          return (int)puVar29;
        }
      }
    }
    else {
      if ((pmVar18->key_exchange | 2) != 7) {
        pcVar25 = "server key exchange message must not be skipped";
        iVar13 = 0x86f;
        goto LAB_001aaecc;
      }
      ssl->keep_current_message = 1;
    }
    ssl->state = ssl->state + 1;
    pcVar25 = "<= parse server key exchange";
    iVar28 = 0;
    iVar23 = 2;
    iVar13 = 0x99c;
    break;
  case 5:
    pmVar18 = ssl->handshake->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x9c3,"=> parse certificate request");
    uVar14 = (uint)pmVar18->key_exchange;
    if ((10 < uVar14) || ((0x61eU >> (uVar14 & 0x1f) & 1) == 0)) {
      pcVar25 = "<= skip parse certificate request";
      iVar13 = 0x9c6;
LAB_001ab0b2:
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar13,pcVar25);
      ssl->state = ssl->state + 1;
      return 0;
    }
    iVar13 = mbedtls_ssl_read_record(ssl,1);
    if (iVar13 != 0) {
      pcVar25 = "mbedtls_ssl_read_record";
      iVar23 = 0x9cc;
      goto LAB_001abaaf;
    }
    if (ssl->in_msgtype != 0x16) {
      pcVar25 = "bad certificate request message";
      iVar13 = 0x9d1;
      goto LAB_001aaecc;
    }
    ssl->state = ssl->state + 1;
    bVar33 = *ssl->in_msg == '\r';
    ssl->handshake->client_auth = bVar33;
    pcVar25 = "no";
    if (bVar33) {
      pcVar25 = "a";
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x9de,"got %s certificate request",pcVar25);
    if (ssl->handshake->client_auth == '\0') {
      ssl->keep_current_message = 1;
    }
    else {
      uVar22 = ssl->in_hslen;
      uVar21 = (ulong)(ssl->conf->transport == '\x01');
      lVar32 = uVar21 * 8;
      uVar30 = lVar32 + 4;
      if (uVar22 <= uVar30) {
        pcVar25 = "bad certificate request message";
        iVar13 = 0xa02;
        goto LAB_001ab22e;
      }
      puVar29 = (ushort *)ssl->in_msg;
      uVar21 = (ulong)(byte)puVar29[uVar21 * 4 + 2];
      if (uVar22 <= uVar21 + uVar30 + 2) {
        pcVar25 = "bad certificate request message";
        iVar13 = 0xa15;
        goto LAB_001ab22e;
      }
      uVar12 = *(ushort *)((long)puVar29 + uVar21 + lVar32 + 5);
      uVar26 = (ulong)(ushort)(uVar12 << 8 | uVar12 >> 8);
      lVar32 = uVar30 + uVar21;
      if (uVar22 <= uVar26 + lVar32 + 3) {
        pcVar25 = "bad certificate request message";
        iVar13 = 0xa2c;
        goto LAB_001ab22e;
      }
      hashlen = uVar21;
      local_38 = puVar29;
      if (uVar26 != 0) {
        uVar30 = 0;
        do {
          in_stack_fffffffffffffe38 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                        (uint)*(byte *)((long)puVar29 + uVar30 + lVar32 + 4));
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xa39,"Supported Signature Algorithm found: %02x %02x",
                     (ulong)*(byte *)((long)puVar29 + uVar30 + lVar32 + 3),in_stack_fffffffffffffe38
                    );
          uVar30 = uVar30 + 2;
        } while (uVar30 < uVar26);
      }
      lVar32 = hashlen + uVar26 + 2;
      uVar30 = (ulong)(ssl->conf->transport == '\x01');
      uVar12 = *(ushort *)((long)local_38 + lVar32 + uVar30 * 8 + 5);
      uVar22 = (ulong)(ushort)(uVar12 << 8 | uVar12 >> 8);
      if (ssl->in_hslen != hashlen + uVar26 + uVar30 * 8 + uVar22 + 9) {
        pcVar25 = "bad certificate request message";
        iVar13 = 0xa45;
        goto LAB_001ab22e;
      }
      if (uVar22 != 0) {
        local_38 = (ushort *)((long)local_38 + lVar32 + uVar30 * 8 + 7);
        hashlen = uVar22 - 2;
        uVar30 = 0;
        do {
          local_48 = (ushort *)((long)local_38 + uVar30) + 1;
          _uStack_a8 = (ushort *)0x0;
          p = (uchar *)0x0;
          local_98 = (uchar *)0x0;
          iStack_90 = 0;
          uStack_8c = 0;
          local_88 = 0;
          puStack_80 = (uchar *)0x0;
          local_78 = (mbedtls_asn1_named_data *)0x0;
          uStack_70 = '\0';
          uStack_6f = 0;
          uVar12 = *(ushort *)((long)local_38 + uVar30);
          uVar21 = (ulong)(ushort)(uVar12 << 8 | uVar12 >> 8);
          if (((hashlen - uVar30 < uVar21) ||
              (iVar13 = mbedtls_asn1_get_tag
                                  ((uchar **)&local_48,(uchar *)((long)local_48 + uVar21),
                                   (size_t *)&local_58,0x30), iVar13 != 0)) ||
             (iVar13 = mbedtls_x509_get_name
                                 ((uchar **)&local_48,
                                  (uchar *)((long)local_48 + CONCAT44(uStack_54,local_58)),
                                  (mbedtls_x509_name *)&stack0xffffffffffffff58), iVar13 != 0)) {
            pcVar25 = "bad certificate request message";
            iVar13 = 0xa58;
            goto LAB_001ab22e;
          }
          uVar14 = mbedtls_x509_dn_gets
                             ((char *)&local_1a8,0x100,(mbedtls_x509_name *)&stack0xffffffffffffff58
                             );
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xa61,"DN hint: %.*s",(ulong)uVar14,&local_1a8);
          mbedtls_asn1_free_named_data_list_shallow(local_78);
          uVar30 = uVar30 + uVar21 + 2;
        } while (uVar30 < uVar22);
      }
    }
    pcVar25 = "<= parse certificate request";
    iVar28 = 0;
    iVar23 = 2;
    iVar13 = 0xa67;
    break;
  case 6:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xa72,"=> parse server hello done");
    iVar13 = mbedtls_ssl_read_record(ssl,1);
    if (iVar13 != 0) {
      pcVar25 = "mbedtls_ssl_read_record";
      iVar23 = 0xa75;
      goto LAB_001abaaf;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xa7a,"bad server hello done message");
      return -0x7700;
    }
    uVar2 = ssl->conf->transport;
    if ((ssl->in_hslen != (ulong)(uVar2 == '\x01') * 8 + 4) || (*ssl->in_msg != '\x0e')) {
      pcVar25 = "bad server hello done message";
      iVar13 = 0xa80;
      goto LAB_001ab22e;
    }
    ssl->state = ssl->state + 1;
    if (uVar2 == '\x01') {
      mbedtls_ssl_recv_flight_completed(ssl);
    }
    pcVar25 = "<= parse server hello done";
    iVar28 = 0;
    iVar23 = 2;
    iVar13 = 0xa8e;
    break;
  case 7:
    iVar13 = mbedtls_ssl_write_certificate(ssl);
    return iVar13;
  case 8:
    pmVar18 = ssl->handshake->ciphersuite_info;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xa9d,"=> write client key exchange");
    if ((pmVar18->key_exchange < 0xb) && ((0x618U >> (pmVar18->key_exchange & 0x1f) & 1) != 0)) {
      iVar13 = mbedtls_ecdh_make_public
                         (&ssl->handshake->ecdh_ctx,&local_1a8,ssl->out_msg + 4,1000,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar13 != 0) {
        pcVar25 = "mbedtls_ecdh_make_public";
        iVar23 = 0xb26;
        goto LAB_001abaaf;
      }
      mbedtls_debug_printf_ecdh
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xb30,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_Q);
      pmVar3 = ssl->handshake;
      iVar13 = mbedtls_ecdh_calc_secret
                         (&pmVar3->ecdh_ctx,&pmVar3->pmslen,pmVar3->premaster,0x20,
                          (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng);
      if (iVar13 != 0) {
        pcVar25 = "mbedtls_ecdh_calc_secret";
        iVar23 = 0xb42;
        goto LAB_001abaaf;
      }
      mbedtls_debug_printf_ecdh
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0xb4c,&ssl->handshake->ecdh_ctx,MBEDTLS_DEBUG_ECDH_Z);
LAB_001aaf57:
      lVar32 = 4;
    }
    else {
      iVar13 = mbedtls_ssl_ciphersuite_uses_psk(pmVar18);
      if (iVar13 == 0) {
        if (pmVar18->key_exchange != '\v') {
          iVar13 = 0xc7d;
          goto LAB_001ab2fe;
        }
        iVar13 = mbedtls_ecjpake_write_round_two
                           (&ssl->handshake->ecjpake_ctx,ssl->out_msg + 4,0x3fc,&local_1a8,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar13 != 0) {
          pcVar25 = "mbedtls_ecjpake_write_round_two";
          iVar23 = 0xc6d;
          goto LAB_001abaaf;
        }
        pmVar3 = ssl->handshake;
        iVar13 = mbedtls_ecjpake_derive_secret
                           (&pmVar3->ecjpake_ctx,pmVar3->premaster,0x20,&pmVar3->pmslen,
                            (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng
                           );
        if (iVar13 != 0) {
          pcVar25 = "mbedtls_ecjpake_derive_secret";
          iVar23 = 0xc75;
          goto LAB_001abaaf;
        }
        goto LAB_001aaf57;
      }
      iVar13 = mbedtls_ssl_conf_has_static_psk(ssl->conf);
      iVar28 = -0x6c00;
      if (iVar13 == 0) {
        return -0x6c00;
      }
      local_1a8 = ssl->conf->psk_identity_len;
      if (local_1a8 - 0x3fb < 0xfffffffffffffbff) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0xbe2,"psk identity too long or SSL buffer too short");
        return -0x6a00;
      }
      ssl->out_msg[4] = (uchar)(local_1a8 >> 8);
      ssl->out_msg[5] = (uchar)local_1a8;
      memcpy(ssl->out_msg + 6,ssl->conf->psk_identity,ssl->conf->psk_identity_len);
      if (pmVar18->key_exchange != '\x05') {
        pcVar25 = "should never happen";
        iVar23 = 1;
        iVar13 = 0xc3d;
        break;
      }
      sVar5 = ssl->conf->psk_identity_len;
      local_1a8 = 0;
      iVar13 = mbedtls_ssl_psk_derive_premaster(ssl,MBEDTLS_KEY_EXCHANGE_PSK);
      if (iVar13 != 0) {
        pcVar25 = "mbedtls_ssl_psk_derive_premaster";
        iVar23 = 0xc46;
        goto LAB_001abaaf;
      }
      lVar32 = sVar5 + 6;
    }
    ssl->out_msglen = lVar32 + local_1a8;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\x10';
    ssl->state = ssl->state + 1;
    iVar13 = mbedtls_ssl_write_handshake_msg_ext(ssl,1,1);
    if (iVar13 != 0) {
      pcVar25 = "mbedtls_ssl_write_handshake_msg";
      iVar23 = 0xc88;
LAB_001abaaf:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,iVar23,pcVar25,iVar13);
      return iVar13;
    }
    pcVar25 = "<= write client key exchange";
    iVar28 = 0;
    iVar23 = 2;
    iVar13 = 0xc8c;
    break;
  case 9:
    pmVar18 = ssl->handshake->ciphersuite_info;
    _uStack_a8 = (ushort *)0x0;
    puVar31 = ssl->out_buf;
    puVar16 = ssl->out_msg;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xcbc,"=> write certificate verify");
    iVar13 = mbedtls_ssl_derive_keys(ssl);
    if (iVar13 == 0) {
      uVar14 = (uint)pmVar18->key_exchange;
      if ((uVar14 < 0xb) && ((0x61eU >> (uVar14 & 0x1f) & 1) != 0)) {
        pmVar3 = ssl->handshake;
        if (pmVar3->client_auth != '\0') {
          if ((pmVar3 == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar17 = pmVar3->key_cert, pmVar17 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar17 = ssl->conf->key_cert;
          }
          if ((pmVar17 != (mbedtls_ssl_key_cert *)0x0) && (pmVar17->cert != (mbedtls_x509_crt *)0x0)
             ) {
            if ((pmVar3 == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar17 = pmVar3->key_cert, pmVar17 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar17 = ssl->conf->key_cert;
            }
            if ((pmVar17 == (mbedtls_ssl_key_cert *)0x0) ||
               (pmVar17->key == (mbedtls_pk_context_conflict *)0x0)) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0xcd8,"got no private key for certificate");
              return -0x7600;
            }
            iVar13 = (*pmVar3->calc_verify)(ssl,(uchar *)&local_1a8,(size_t *)&local_48);
            if (iVar13 == 0) {
              bVar33 = ssl->handshake->ciphersuite_info->mac == '\n';
              ssl->out_msg[4] = bVar33 + '\x04';
              if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
                 (pmVar17 = ssl->handshake->key_cert, pmVar17 == (mbedtls_ssl_key_cert *)0x0)) {
                pmVar17 = ssl->conf->key_cert;
              }
              if (pmVar17 == (mbedtls_ssl_key_cert *)0x0) {
                pmVar24 = (mbedtls_pk_context_conflict *)0x0;
              }
              else {
                pmVar24 = pmVar17->key;
              }
              uVar10 = mbedtls_ssl_sig_from_pk(pmVar24);
              ssl->out_msg[5] = uVar10;
              local_48 = (ushort *)0x0;
              if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
                 (pmVar17 = ssl->handshake->key_cert, pmVar17 == (mbedtls_ssl_key_cert *)0x0)) {
                pmVar17 = ssl->conf->key_cert;
              }
              if (pmVar17 == (mbedtls_ssl_key_cert *)0x0) {
                pmVar24 = (mbedtls_pk_context_conflict *)0x0;
              }
              else {
                pmVar24 = pmVar17->key;
              }
              iVar13 = mbedtls_pk_sign_restartable
                                 (pmVar24,bVar33 + MBEDTLS_MD_SHA256,(uchar *)&local_1a8,0,
                                  ssl->out_msg + 8,(size_t)(puVar31 + (0x425 - (long)puVar16)),
                                  (size_t *)&stack0xffffffffffffff58,
                                  (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                  ssl->conf->p_rng,(mbedtls_pk_restart_ctx *)0x0);
              if (iVar13 == 0) {
                *(ushort *)(ssl->out_msg + 6) = uStack_a8 << 8 | uStack_a8 >> 8;
                ssl->out_msglen = (size_t)(_uStack_a8 + 4);
                ssl->out_msgtype = 0x16;
                *ssl->out_msg = '\x0f';
                ssl->state = ssl->state + 1;
                iVar13 = mbedtls_ssl_write_handshake_msg_ext(ssl,1,1);
                if (iVar13 == 0) {
                  pcVar25 = "<= write certificate verify";
                  iVar28 = 0;
                  iVar23 = 2;
                  iVar13 = 0xd2c;
                  break;
                }
                pcVar25 = "mbedtls_ssl_write_handshake_msg";
                iVar23 = 0xd28;
              }
              else {
                pcVar25 = "mbedtls_pk_sign";
                iVar23 = 0xd16;
              }
            }
            else {
              pcVar25 = "calc_verify";
              iVar23 = 0xce9;
            }
            goto LAB_001abaaf;
          }
        }
        pcVar25 = "<= skip write certificate verify";
        iVar13 = 0xcd2;
      }
      else {
        pcVar25 = "<= skip write certificate verify";
        iVar13 = 0xccb;
      }
      goto LAB_001ab0b2;
    }
    pcVar25 = "mbedtls_ssl_derive_keys";
    iVar23 = 0xcc6;
    goto LAB_001abaaf;
  case 10:
    iVar13 = mbedtls_ssl_write_change_cipher_spec(ssl);
    return iVar13;
  case 0xb:
    iVar13 = mbedtls_ssl_write_finished(ssl);
    return iVar13;
  case 0xc:
    iVar13 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar13;
  case 0xd:
    iVar13 = mbedtls_ssl_parse_finished(ssl);
    return iVar13;
  case 0xe:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xe07,"handshake: done");
    ssl->state = 0xf;
    return 0;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    return 0;
  default:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0xe10,"invalid state %d");
    return -0x7100;
  }
  mbedtls_debug_print_msg
            (ssl,iVar23,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
             ,iVar13,pcVar25);
  return iVar28;
}

Assistant:

int mbedtls_ssl_handshake_client_step(mbedtls_ssl_context *ssl)
{
    int ret = 0;

    /* Change state now, so that it is right in mbedtls_ssl_read_record(), used
     * by DTLS for dropping out-of-sequence ChangeCipherSpec records */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if (ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC &&
        ssl->handshake->new_session_ticket != 0) {
        ssl->state = MBEDTLS_SSL_NEW_SESSION_TICKET;
    }
#endif

    switch (ssl->state) {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  ==>   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = mbedtls_ssl_write_client_hello(ssl);
            break;

        /*
         *  <==   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_parse_server_hello(ssl);
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate(ssl);
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_parse_server_key_exchange(ssl);
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_parse_certificate_request(ssl);
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_parse_server_hello_done(ssl);
            break;

        /*
         *  ==> ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_write_client_key_exchange(ssl);
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_write_certificate_verify(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_write_change_cipher_spec(ssl);
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_write_finished(ssl);
            break;

            /*
             *  <==   ( NewSessionTicket )
             *        ChangeCipherSpec
             *        Finished
             */
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        case MBEDTLS_SSL_NEW_SESSION_TICKET:
            ret = ssl_parse_new_session_ticket(ssl);
            break;
#endif

        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec(ssl);
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_parse_finished(ssl);
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG(2, ("handshake: done"));
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup(ssl);
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG(1, ("invalid state %d", ssl->state));
            return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    return ret;
}